

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

int map_clear(map m)

{
  void *__ptr;
  ulong uVar1;
  size_t size;
  bucket pbVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar3 = 1;
  if (m != (map)0x0) {
    pbVar2 = m->buckets;
    if (pbVar2 != (bucket)0x0) {
      uVar1 = m->capacity;
      if (uVar1 != 0) {
        lVar4 = 0x10;
        uVar5 = 0;
        do {
          __ptr = *(void **)((long)&m->buckets->count + lVar4);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            uVar1 = m->capacity;
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x18;
        } while (uVar5 < uVar1);
        pbVar2 = m->buckets;
      }
      free(pbVar2);
    }
    iVar3 = 0;
    m->count = 0;
    m->prime = 0;
    size = bucket_capacity(0);
    m->capacity = size;
    pbVar2 = bucket_create(size);
    m->buckets = pbVar2;
    if (pbVar2 == (bucket)0x0) {
      log_write_impl_va("metacall",0x1d1,"map_clear",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Bad map clear bucket creation");
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int map_clear(map m)
{
	if (m == NULL)
	{
		return 1;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map clear bucket creation");
		return 1;
	}

	return 0;
}